

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

void helper_neon_qunzip16_aarch64(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  uVar3 = *vm;
  uVar4 = *(ulong *)((long)vm + 8);
  *(ulong *)vm = uVar2 & 0xffff000000000000 |
                 (ulong)((uint)(uVar1 >> 0x20) & 0xffff0000) | uVar1 >> 0x10 & 0xffff |
                 uVar2 << 0x10 & 0xffff00000000;
  *(ulong *)((long)vm + 8) =
       uVar4 & 0xffff000000000000 |
       (ulong)((uint)(uVar3 >> 0x20) & 0xffff0000) | uVar3 >> 0x10 & 0xffff |
       uVar4 << 0x10 & 0xffff00000000;
  *(ulong *)vd = uVar2 << 0x10 & 0xffff000000000000 |
                 (uVar2 & 0xffff) << 0x20 |
                 (ulong)((uint)(uVar1 >> 0x10) & 0xffff0000) | uVar1 & 0xffff;
  *(ulong *)((long)vd + 8) =
       uVar4 << 0x10 & 0xffff000000000000 |
       (uVar4 & 0xffff) << 0x20 | (ulong)((uint)(uVar3 >> 0x10) & 0xffff0000) | uVar3 & 0xffff;
  return;
}

Assistant:

void HELPER(neon_qunzip16)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd0 = rd[0], zd1 = rd[1];
    uint64_t zm0 = rm[0], zm1 = rm[1];

    uint64_t d0 = ELEM(zd0, 0, 16) | (ELEM(zd0, 2, 16) << 16)
        | (ELEM(zd1, 0, 16) << 32) | (ELEM(zd1, 2, 16) << 48);
    uint64_t d1 = ELEM(zm0, 0, 16) | (ELEM(zm0, 2, 16) << 16)
        | (ELEM(zm1, 0, 16) << 32) | (ELEM(zm1, 2, 16) << 48);
    uint64_t m0 = ELEM(zd0, 1, 16) | (ELEM(zd0, 3, 16) << 16)
        | (ELEM(zd1, 1, 16) << 32) | (ELEM(zd1, 3, 16) << 48);
    uint64_t m1 = ELEM(zm0, 1, 16) | (ELEM(zm0, 3, 16) << 16)
        | (ELEM(zm1, 1, 16) << 32) | (ELEM(zm1, 3, 16) << 48);

    rm[0] = m0;
    rm[1] = m1;
    rd[0] = d0;
    rd[1] = d1;
}